

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O0

function<chaiscript::Boxed_Value_()> *
chaiscript::dispatch::functor<chaiscript::Boxed_Value()>
          (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           *funcs,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator funcs_00;
  undefined8 uVar3;
  type_info *in_RDX;
  bad_boxed_cast *in_RSI;
  function<chaiscript::Boxed_Value_()> *in_RDI;
  Type_Info in_stack_00000000;
  _func_Boxed_Value *p;
  bool has_arity_match;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *in_stack_ffffffffffffff68;
  Type_Conversions_State *in_stack_ffffffffffffffc8;
  
  cVar2 = std::
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          ::begin(in_stack_ffffffffffffff68);
  funcs_00 = std::
             vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
             ::end(in_stack_ffffffffffffff68);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>,chaiscript::dispatch::functor<chaiscript::Boxed_Value()>(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>const&,chaiscript::Type_Conversions_State_const*)::_lambda(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)_1_>
                    (cVar2._M_current,funcs_00._M_current);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x48);
    user_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>();
    exception::bad_boxed_cast::bad_boxed_cast(in_RSI,in_stack_00000000,in_RDX);
    __cxa_throw(uVar3,&exception::bad_boxed_cast::typeinfo,
                exception::bad_boxed_cast::~bad_boxed_cast);
  }
  detail::build_function_caller_helper<chaiscript::Boxed_Value>
            ((_func_Boxed_Value *)cVar2._M_current,
             (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)funcs_00._M_current,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

std::function<FunctionType>
      functor(const std::vector<Const_Proxy_Function> &funcs, const Type_Conversions_State *t_conversions)
      {
        const bool has_arity_match = std::any_of(funcs.begin(), funcs.end(),
            [](const Const_Proxy_Function &f) {
              return f->get_arity() == -1 || size_t(f->get_arity()) == chaiscript::dispatch::detail::Arity<FunctionType>::arity;
            });

        if (!has_arity_match) {
          throw exception::bad_boxed_cast(user_type<Const_Proxy_Function>(), typeid(std::function<FunctionType>));
        }

        FunctionType *p=nullptr;
        return detail::build_function_caller_helper(p, funcs, t_conversions);
      }